

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O0

Duration __thiscall kj::Thread::getCpuTime(Thread *this)

{
  int osErrorNumber;
  void *pvVar1;
  Quantity<long,_kj::_::NanosecondLabel> QVar2;
  Quantity<long,_kj::_::NanosecondLabel> local_80;
  undefined8 local_78;
  Quantity<long,_kj::_::NanosecondLabel> local_70;
  Fault local_68;
  Fault f_1;
  SyscallResult local_4c;
  long lStack_48;
  SyscallResult _kjSyscallResult;
  timespec ts;
  Fault local_28;
  Fault f;
  int pthreadResult;
  clockid_t clockId;
  Thread *this_local;
  
  f.exception._0_4_ = pthread_getcpuclockid(this->threadId,(__clockid_t *)((long)&f.exception + 4));
  if ((int)f.exception != 0) {
    kj::_::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
               ,0x84,(int)f.exception,"pthread_getcpuclockid","");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  f_1.exception = (Exception *)((long)&f.exception + 4);
  local_4c = kj::_::Debug::syscall<kj::Thread::getCpuTime()const::__0>
                       ((anon_class_16_2_6803528d *)&f_1,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_4c);
  if (pvVar1 != (void *)0x0) {
    local_78 = 1000000000;
    local_70 = operator*<long,_long,_kj::_::NanosecondLabel,_void>
                         (lStack_48,(Quantity<long,_kj::_::NanosecondLabel>)0x3b9aca00);
    local_80 = operator*<long,_long,_kj::_::NanosecondLabel,_void>
                         (ts.tv_sec,(Quantity<long,_kj::_::NanosecondLabel>)0x1);
    QVar2 = Quantity<long,_kj::_::NanosecondLabel>::operator+<long>(&local_70,&local_80);
    return (Duration)QVar2.value;
  }
  osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_4c);
  kj::_::Debug::Fault::Fault
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
             ,0x88,osErrorNumber,"clock_gettime(clockId, &ts)","");
  kj::_::Debug::Fault::fatal(&local_68);
}

Assistant:

kj::Duration Thread::getCpuTime() const {
  clockid_t clockId;
  int pthreadResult = pthread_getcpuclockid(
      *reinterpret_cast<const pthread_t*>(&threadId), &clockId);
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_getcpuclockid", pthreadResult);
  }

  struct timespec ts;
  KJ_SYSCALL(clock_gettime(clockId, &ts));

  return ts.tv_sec * kj::SECONDS + ts.tv_nsec * kj::NANOSECONDS;
}